

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O2

int adiak_launchdate(void)

{
  int iVar1;
  int iVar2;
  timeval stime;
  
  iVar1 = adksys_starttime(&stime);
  iVar2 = -1;
  if ((iVar1 != -1) && (stime.tv_usec != 0 || stime.tv_sec != 0)) {
    iVar2 = 0;
    adiak_namevalue("launchdate",2,"runinfo","%D");
  }
  return iVar2;
}

Assistant:

int adiak_launchdate()
{
   int result;
   struct timeval stime;
   result = adksys_starttime(&stime);
   if (result == -1)
      return -1;
   if (stime.tv_sec == 0 && stime.tv_usec == 0)
      return -1;
   adiak_namevalue("launchdate", adiak_general, "runinfo", "%D", stime.tv_sec);
   return 0;
}